

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_test.c
# Opt level: O2

nifti_image * generate_reference_image(char *write_image_filename,int *Errors)

{
  int iVar1;
  nifti_image *nim;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  undefined4 *puVar5;
  undefined1 *puVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  nifti_1_header in_stack_fffffffffffffd08;
  int swapsize;
  int nbyper;
  undefined4 local_190 [8];
  undefined4 local_170;
  undefined1 local_16a;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined2 local_148;
  undefined8 local_144;
  undefined8 uStack_13c;
  undefined8 local_134;
  undefined8 uStack_12c;
  undefined8 local_120;
  undefined1 local_fc [104];
  undefined4 local_94;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined8 local_74;
  undefined8 uStack_6c;
  undefined4 local_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  char local_48 [24];
  
  bVar9 = 0;
  uVar4 = 0;
  memset(local_190,0,0x100);
  local_190[0] = 0x15c;
  local_16a = 0x72;
  local_170 = 0x4000;
  local_168 = 0xb001100170005;
  uStack_160 = 0x1000100030007;
  local_158 = 0x4e6b79a34b1a2112;
  local_150 = 0x803e9c49a4000;
  local_144 = 0x3e800000bf800000;
  uStack_13c = 0x3f8000003f000000;
  local_134 = 0x4080000040000000;
  uStack_12c = 0xd09502f9d09502f9;
  local_120 = 0x430000003e800000;
  local_94 = 0x10001;
  local_90 = 0x3f000000bf000000;
  uStack_88 = 0x41380000bf000000;
  local_80 = 0x40b0000041080000;
  local_78 = 0x3f000000;
  local_74 = 0;
  uStack_6c = 0;
  local_64 = 0x3f800000;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0x40000000;
  builtin_strncpy(local_48 + 0x10,"n+1",4);
  builtin_strncpy(local_48,"PHANTOM_DATA to ",0x10);
  memcpy(local_fc,
         "This is a very long dialog here to use up more than 80 characters of space to test to see if the code is robust enough to deal appropriatly with very long and obnoxious lines."
         ,0x50);
  nifti_datatype_sizes(8,&nbyper,&swapsize);
  local_148 = (short)(nbyper << 3);
  puVar5 = local_190;
  puVar6 = &stack0xfffffffffffffd08;
  for (lVar3 = 0x15c; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar6 = *(undefined1 *)puVar5;
    puVar5 = (undefined4 *)((long)puVar5 + (ulong)bVar9 * -2 + 1);
    puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
  }
  nim = nifti_convert_nhdr2nim(in_stack_fffffffffffffd08,write_image_filename);
  uVar7 = nim->ny * nim->nx * nim->nz * nim->nt * nim->nu;
  pvVar2 = calloc((ulong)uVar7,4);
  nim->data = pvVar2;
  _PrintTest(0x65,"Checking memory allocation",(uint)(pvVar2 == (void *)0x0),NIFTITEST_TRUE,Errors);
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar4;
  }
  for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    *(int *)((long)nim->data + uVar4 * 4) = (int)uVar4;
  }
  iVar1 = nifti_set_filenames(nim,write_image_filename,0,0);
  _PrintTest(0x6e,"Setting filenames",(uint)(iVar1 != 0),NIFTITEST_TRUE,Errors);
  iVar1 = nifti_set_type_from_names(nim);
  _PrintTest(0x6f,"Setting type from names",(uint)(iVar1 != 0),NIFTITEST_TRUE,Errors);
  _PrintTest(0x71,"Check reference_image data is non null",(uint)(nim->data == (void *)0x0),
             NIFTITEST_TRUE,Errors);
  return nim;
}

Assistant:

nifti_image * generate_reference_image( const char * write_image_filename , int * const Errors)
{
  nifti_1_header reference_header;
  memset(&reference_header,0,sizeof(reference_header));
  reference_header.sizeof_hdr=sizeof(reference_header);
  reference_header.regular='r';
  reference_header.extents=16384;

  reference_header.dim[0]=5;
  reference_header.dim[1]=23;
  reference_header.dim[2]=17;
  reference_header.dim[3]=11;
  reference_header.dim[4]=7;
  reference_header.dim[5]=3;
  reference_header.dim[6]=1; //This MUST be 1 anything else is invalid due to code that usees huristics to fix other possible problems;
  reference_header.dim[7]=1; //This MUST be 1 anything else is invalid due to code that usees huristics to fix other possible problems;
  reference_header.intent_p1=10101010.101F;
  reference_header.intent_p2=987654321.0F;
  reference_header.intent_p3=-1234.0F;
  reference_header.intent_code=NIFTI_INTENT_ESTIMATE;
  reference_header.datatype=DT_INT32;
  reference_header.pixdim[0]=-1.0F; /* this is really qfac */
  reference_header.pixdim[1]=0.25F;
  reference_header.pixdim[2]=0.5F;
  reference_header.pixdim[3]=1.0F;
  reference_header.pixdim[4]=2.0F;
  reference_header.pixdim[5]=4.0F;
  reference_header.pixdim[6]=-2.0e10F;
  reference_header.pixdim[7]=-2.0e10F;
  reference_header.vox_offset=0;
  reference_header.scl_slope=0.25;
  reference_header.scl_inter=128;
  reference_header.qform_code=NIFTI_XFORM_SCANNER_ANAT;
  reference_header.quatern_b=-0.5F;
  reference_header.quatern_c= 0.5F;
  reference_header.quatern_d=-0.5F;
  reference_header.qoffset_x=reference_header.dim[1]/2.0F;
  reference_header.qoffset_y=reference_header.dim[2]/2.0F;
  reference_header.qoffset_z=reference_header.dim[3]/2.0F;
  reference_header.sform_code=NIFTI_XFORM_SCANNER_ANAT;
  reference_header.srow_x[0]=0.5;
  reference_header.srow_x[1]=0.0;
  reference_header.srow_x[2]=0.0;
  reference_header.srow_x[3]=0.0;
  reference_header.srow_y[0]=0.0;
  reference_header.srow_y[1]=1.0;
  reference_header.srow_y[2]=0.0;
  reference_header.srow_y[3]=0.0;
  reference_header.srow_z[0]=0.0;
  reference_header.srow_z[1]=0.0;
  reference_header.srow_z[2]=2.0;
  reference_header.srow_z[3]=0.0;
  reference_header.magic[0]='n';
  reference_header.magic[1]='+';
  reference_header.magic[2]='1';
  reference_header.magic[3]='\0';
  /* String is purposfully too long */
  strncpy(reference_header.intent_name,"PHANTOM_DATA to be used for regression testing the nifti reader/writer",16);
  strncpy(reference_header.descrip,"This is a very long dialog here to use up more than 80 characters of space to test to see if the code is robust enough to deal appropriatly with very long and obnoxious lines.",80);

  {
  int nbyper;
  int swapsize;
  nifti_datatype_sizes(reference_header.datatype ,&nbyper,&swapsize);
  reference_header.bitpix=nbyper*8;
  }

  nifti_image * reference_image=nifti_convert_nhdr2nim(reference_header,write_image_filename);
  {
  const unsigned int NumVoxels=reference_image->nx*reference_image->ny*reference_image->nz*reference_image->nt*reference_image->nu;
  reference_image->data=(signed int *)calloc(NumVoxels,sizeof(signed int)) ; /*!< pointer to data: nbyper*nvox bytes     */
  PrintTest("Checking memory allocation",reference_image->data ==0 ,NIFTITEST_TRUE,Errors);
  {
  signed int i=0;
  for(; i < (signed int)NumVoxels ; i++)
    {
    ((signed int *)(reference_image->data))[i]=i;
    }
  }
  }
  PrintTest("Setting filenames",nifti_set_filenames( reference_image,write_image_filename, 0, 0 ) != 0, NIFTITEST_TRUE,Errors);
  PrintTest("Setting type from names",nifti_set_type_from_names( reference_image ) != 0, NIFTITEST_TRUE,Errors);
  /*   PrintTest("Checking type and names",nifti_type_and_names_match( reference_image , 1 ) != 1, NIFTITEST_TRUE,Errors); */
  PrintTest("Check reference_image data is non null",(reference_image->data==0),NIFTITEST_TRUE,Errors);
  return reference_image;
}